

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  u8 uVar1;
  undefined4 uVar2;
  Fts3Cursor *pCsr;
  sqlite3_vtab *psVar3;
  sqlite3_int64 sVar4;
  int iVar5;
  int iVar6;
  Fts3Expr *pExpr_00;
  u32 *puVar7;
  void *pvVar8;
  undefined4 *puVar9;
  Fts3Expr *pFVar10;
  long lVar11;
  long lVar12;
  Fts3Expr *pFVar13;
  int local_68;
  u8 local_61;
  ulong local_60;
  sqlite3_int64 local_58;
  sqlite3_int64 local_50;
  long local_48;
  Fts3Expr *local_40;
  long local_38;
  
  pCsr = *pCtx;
  local_38 = *(long *)((long)pCtx + 0x20);
  local_48 = (long)(iPhrase * *(int *)((long)pCtx + 8) * 3);
  psVar3 = (pCsr->base).pVtab;
  if ((pExpr->bDeferred != '\0') && (pExpr->pParent->eType != 1)) {
    if (*(int *)&psVar3[2].pModule < 1) {
      return 0;
    }
    uVar2 = (undefined4)pCsr->nDoc;
    puVar9 = (undefined4 *)(local_38 + local_48 * 4 + 8);
    lVar11 = 0;
    do {
      puVar9[-1] = uVar2;
      *puVar9 = uVar2;
      lVar11 = lVar11 + 1;
      puVar9 = puVar9 + 3;
    } while (lVar11 < *(int *)&psVar3[2].pModule);
    return 0;
  }
  local_68 = 0;
  if (pExpr->aMI == (u32 *)0x0) {
    local_58 = pCsr->iPrevId;
    pFVar13 = pExpr;
    do {
      pExpr_00 = pFVar13;
      pFVar13 = pExpr_00->pParent;
      if (pFVar13 == (Fts3Expr *)0x0) break;
    } while (pFVar13->eType == 1);
    local_50 = pExpr_00->iDocid;
    local_61 = pExpr_00->bEof;
    local_60 = CONCAT71((int7)((ulong)local_50 >> 8),pExpr_00 == (Fts3Expr *)0x0);
    local_40 = pExpr;
    if (pExpr_00 != (Fts3Expr *)0x0) {
      local_60 = 0;
      pFVar13 = pExpr_00;
      do {
        pFVar10 = pFVar13;
        if (pFVar13->eType != 5) {
          pFVar10 = pFVar13->pRight;
        }
        iVar6 = *(int *)&psVar3[2].pModule;
        iVar5 = sqlite3_initialize();
        if (iVar5 == 0) {
          puVar7 = (u32 *)sqlite3Malloc((long)iVar6 * 0xc);
        }
        else {
          puVar7 = (u32 *)0x0;
        }
        pFVar10->aMI = puVar7;
        if (puVar7 == (u32 *)0x0) goto LAB_001dcbff;
        pvVar8 = memset(puVar7,0,(long)*(int *)&psVar3[2].pModule * 0xc);
        pFVar13 = pFVar13->pLeft;
        local_60 = CONCAT71((int7)((ulong)pvVar8 >> 8),pFVar13 == (Fts3Expr *)0x0);
      } while (pFVar13 != (Fts3Expr *)0x0);
    }
    fts3EvalRestart(pCsr,pExpr_00,&local_68);
    sVar4 = local_50;
    uVar1 = pCsr->isEof;
    while ((uVar1 == '\0' && (local_68 == 0))) {
      do {
        if (pCsr->isRequireSeek == '\0') {
          sqlite3_reset(pCsr->pStmt);
        }
        fts3EvalNextRow(pCsr,pExpr_00,&local_68);
        uVar1 = pExpr_00->bEof;
        pCsr->isEof = uVar1;
        pCsr->isRequireSeek = '\x01';
        pCsr->isMatchinfoNeeded = 1;
        pCsr->iPrevId = pExpr_00->iDocid;
      } while (((uVar1 == '\0') && (pExpr_00->eType == 1)) &&
              (iVar6 = sqlite3Fts3EvalTestDeferred(pCsr,&local_68), iVar6 != 0));
      if ((local_68 == 0) && (pCsr->isEof == '\0')) {
        fts3EvalUpdateCounts(pExpr_00,*(int *)&psVar3[2].pModule);
      }
      uVar1 = pCsr->isEof;
    }
    pCsr->isEof = '\0';
    pCsr->iPrevId = local_58;
    if (local_61 == '\0') {
      fts3EvalRestart(pCsr,pExpr_00,&local_68);
      do {
        fts3EvalNextRow(pCsr,pExpr_00,&local_68);
        if (pExpr_00->iDocid == sVar4) break;
      } while (local_68 == 0);
    }
    else {
      pExpr_00->bEof = local_61;
    }
LAB_001dcbff:
    pExpr = local_40;
    iVar6 = 7;
    if ((local_60 & 1) == 0) goto LAB_001dcc1d;
  }
  local_40 = pExpr;
  iVar6 = local_68;
LAB_001dcc1d:
  if (iVar6 != 0) {
    return iVar6;
  }
  if (*(int *)&psVar3[2].pModule < 1) {
    return 0;
  }
  local_38 = local_38 + local_48 * 4;
  puVar7 = local_40->aMI;
  lVar11 = 8;
  lVar12 = 0;
  do {
    *(undefined4 *)(local_38 + -4 + lVar11) = *(undefined4 *)((long)puVar7 + lVar11 + -4);
    *(undefined4 *)(local_38 + lVar11) = *(undefined4 *)((long)puVar7 + lVar11);
    lVar12 = lVar12 + 1;
    lVar11 = lVar11 + 0xc;
  } while (lVar12 < *(int *)&psVar3[2].pModule);
  return 0;
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}